

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor_Common.cpp
# Opt level: O1

void nullcPrintFunctionPointerInfo(ExternTypeInfo *type,char *ptr,uint indentDepth)

{
  char *pcVar1;
  ExternTypeInfo *pEVar2;
  ExternFuncInfo *pEVar3;
  ExternMemberInfo *pEVar4;
  ExternLocalInfo *pEVar5;
  uint uVar6;
  char *pcVar7;
  uint uVar8;
  uint uVar9;
  
  pcVar1 = nullcDebugSymbols((uint *)0x0);
  pEVar2 = nullcDebugTypeInfo((uint *)0x0);
  pEVar3 = nullcDebugFunctionInfo((uint *)0x0);
  pEVar4 = nullcDebugTypeExtraInfo((uint *)0x0);
  pEVar5 = nullcDebugLocalInfo((uint *)0x0);
  pEVar3 = pEVar3 + *(int *)(ptr + 8);
  uVar8 = pEVar4[(type->field_11).subType].type;
  uVar9 = indentDepth;
  if (indentDepth != 0) {
    do {
      printf("  ");
      uVar9 = uVar9 - 1;
    } while (uVar9 != 0);
  }
  printf("function %d %s %s(",(ulong)*(uint *)(ptr + 8),pcVar1 + pEVar2[uVar8].offsetToName,
         pcVar1 + pEVar3->offsetToName);
  uVar8 = pEVar3->paramCount;
  if (uVar8 != 0) {
    uVar9 = 0;
    do {
      uVar6 = pEVar3->offsetToFirstLocal + uVar9;
      pcVar7 = ", ";
      if (uVar9 == uVar8 - 1) {
        pcVar7 = "";
      }
      printf("%s %s%s",pcVar1 + pEVar2[pEVar5[uVar6].type].offsetToName,
             pcVar1 + pEVar5[uVar6].offsetToName,pcVar7);
      uVar9 = uVar9 + 1;
      uVar8 = pEVar3->paramCount;
    } while (uVar9 < uVar8);
  }
  puts(")");
  uVar8 = indentDepth;
  if (indentDepth != 0) {
    do {
      printf("  ");
      uVar8 = uVar8 - 1;
    } while (uVar8 != 0);
  }
  if ((ulong)pEVar3->contextType == 0xffffffff) {
    pcVar1 = "void ref";
  }
  else {
    pcVar1 = pcVar1 + pEVar2[pEVar3->contextType].offsetToName;
  }
  printf("%s context = %p\n",pcVar1,*(undefined8 *)ptr);
  if (*(char **)ptr == (char *)0x0) {
    return;
  }
  nullcPrintVariableInfo
            (pEVar2 + pEVar2[pEVar3->contextType].field_11.subType,*(char **)ptr,indentDepth + 1);
  return;
}

Assistant:

void nullcPrintFunctionPointerInfo(const ExternTypeInfo& type, char* ptr, unsigned indentDepth)
{
	char *codeSymbols = nullcDebugSymbols(NULL);
	ExternTypeInfo *codeTypes = nullcDebugTypeInfo(NULL);
	ExternFuncInfo *codeFunctions = nullcDebugFunctionInfo(NULL);
	ExternMemberInfo *codeTypeExtra = nullcDebugTypeExtraInfo(NULL);
	ExternLocalInfo *codeLocals = nullcDebugLocalInfo(NULL);

	ExternFuncInfo &func = codeFunctions[*(int*)(ptr + NULLC_PTR_SIZE)];
	ExternTypeInfo &returnType = codeTypes[codeTypeExtra[type.memberOffset].type];

	nullcPrintDepthIndent(indentDepth);
	printf("function %d %s %s(", *(int*)(ptr + NULLC_PTR_SIZE), codeSymbols + returnType.offsetToName, codeSymbols + func.offsetToName);
	for(unsigned arg = 0; arg < func.paramCount; arg++)
	{
		ExternLocalInfo &lInfo = codeLocals[func.offsetToFirstLocal + arg];
		printf("%s %s%s", codeSymbols + codeTypes[lInfo.type].offsetToName, codeSymbols + lInfo.offsetToName, arg == func.paramCount - 1 ? "" : ", ");
	}
	printf(")\n");

	nullcPrintDepthIndent(indentDepth);
	printf("%s context = %p\n", func.contextType == ~0u ? "void ref" : codeSymbols + codeTypes[func.contextType].offsetToName, *(void**)(ptr));

	if(*(char**)(ptr))
		nullcPrintVariableInfo(codeTypes[codeTypes[func.contextType].subType], *(char**)(ptr), indentDepth + 1);
}